

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# orphan.h
# Opt level: O0

Orphan<capnp::Text> * __thiscall
capnp::Orphanage::newOrphanCopy<capnp::Text::Reader>
          (Orphan<capnp::Text> *__return_storage_ptr__,Orphanage *this,Reader copyFrom)

{
  BuilderArena *src;
  OrphanBuilder local_48;
  Orphanage *local_28;
  Orphanage *this_local;
  Reader copyFrom_local;
  
  copyFrom_local.super_StringPtr.content.ptr = copyFrom.super_StringPtr.content.size_;
  this_local = copyFrom.super_StringPtr.content.ptr;
  src = this->arena;
  local_28 = this;
  copyFrom_local.super_StringPtr.content.size_ = (size_t)__return_storage_ptr__;
  GetInnerReader<capnp::Text,_(capnp::Kind)1>::apply((Reader *)&this_local);
  capnp::_::OrphanBuilder::copy((EVP_PKEY_CTX *)&local_48,(EVP_PKEY_CTX *)src);
  Orphan<capnp::Text>::Orphan(__return_storage_ptr__,&local_48);
  capnp::_::OrphanBuilder::~OrphanBuilder(&local_48);
  return __return_storage_ptr__;
}

Assistant:

inline Orphan<FromReader<Reader>> Orphanage::newOrphanCopy(Reader copyFrom) const {
  return Orphan<FromReader<Reader>>(_::OrphanBuilder::copy(
      arena, capTable, GetInnerReader<FromReader<Reader>>::apply(copyFrom)));
}